

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall
Js::FunctionBody::RecordStatementMap
          (FunctionBody *this,SmallSpanSequenceIter *iter,StatementData *data)

{
  code *pcVar1;
  bool bVar2;
  void *pvVar3;
  undefined4 *puVar4;
  HeapAllocator *alloc;
  Type this_00;
  undefined1 local_58 [8];
  TrackAllocData data_1;
  
  pvVar3 = FunctionProxy::GetAuxPtrWithLock((FunctionProxy *)this,StatementMaps);
  if (pvVar3 != (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x123,"(!this->GetStatementMaps())","!this->GetStatementMaps()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this_00 = (this->m_sourceInfo).pSpanSequence;
  if (this_00 == (Type)0x0) {
    local_58 = (undefined1  [8])&SmallSpanSequence::typeinfo;
    data_1.typeinfo = (type_info *)0x0;
    data_1.plusSize = 0xffffffffffffffff;
    data_1.count = (size_t)anon_var_dwarf_2ab02c8;
    data_1.filename._0_4_ = 0x127;
    alloc = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_58);
    this_00 = (Type)new<Memory::HeapAllocator>(0x18,alloc,0x2ff150);
    SmallSpanSequence::SmallSpanSequence(this_00);
    (this->m_sourceInfo).pSpanSequence = this_00;
  }
  SmallSpanSequence::RecordARange(this_00,iter,data);
  return;
}

Assistant:

void
    FunctionBody::RecordStatementMap(SmallSpanSequenceIter &iter, StatementData * data)
    {
        Assert(!this->GetStatementMaps());

        if (!this->m_sourceInfo.pSpanSequence)
        {
            this->m_sourceInfo.pSpanSequence = HeapNew(SmallSpanSequence);
        }

        this->m_sourceInfo.pSpanSequence->RecordARange(iter, data);
    }